

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O3

void __thiscall sampler_tester::sampler_tester(sampler_tester *this,size_t n_vocab)

{
  pointer *pplVar1;
  iterator __position;
  pointer plVar2;
  pointer plVar3;
  int iVar4;
  llama_token_data local_34;
  
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve(&this->cur,n_vocab);
  if (0 < (int)n_vocab) {
    iVar4 = 0;
    do {
      local_34.logit = logf((float)iVar4);
      local_34.p = 0.0;
      __position._M_current =
           (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_34.id = iVar4;
      if (__position._M_current ==
          (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llama_token_data,_std::allocator<llama_token_data>_>::
        _M_realloc_insert<llama_token_data>(&this->cur,__position,&local_34);
      }
      else {
        (__position._M_current)->p = 0.0;
        (__position._M_current)->id = iVar4;
        (__position._M_current)->logit = local_34.logit;
        pplVar1 = &(this->cur).
                   super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      iVar4 = iVar4 + 1;
    } while ((int)n_vocab != iVar4);
  }
  plVar2 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->cur_p).data = plVar2;
  (this->cur_p).size = ((long)plVar3 - (long)plVar2 >> 2) * -0x5555555555555555;
  (this->cur_p).selected = -1;
  (this->cur_p).sorted = false;
  return;
}

Assistant:

sampler_tester(size_t n_vocab) {
        cur.reserve(n_vocab);
        for (llama_token token_id = 0; token_id < (llama_token)n_vocab; token_id++) {
            const float logit = logf(token_id);
            cur.emplace_back(llama_token_data{token_id, logit, 0.0f});
        }

        cur_p = llama_token_data_array { cur.data(), cur.size(), -1, false };
    }